

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_ldm_fillHashTable(ldmState_t *state,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  U32 UVar1;
  U32 UVar2;
  undefined4 uVar3;
  ldmParams_t ldmParams;
  ulong uVar4;
  ulong uVar5;
  U64 rollingHash;
  BYTE *pBVar6;
  U32 offset;
  int iStack_3c;
  
  uVar4 = (ulong)params->minMatchLength;
  if (uVar4 == 0) {
    rollingHash = 0;
  }
  else {
    uVar5 = 0;
    rollingHash = 0;
    do {
      rollingHash = rollingHash * -0x30e44323485a9b9d + (ulong)ip[uVar5] + 10;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  UVar1 = params->hashLog;
  UVar2 = params->bucketSizeLog;
  uVar3 = params->minMatchLength;
  ldmParams = *params;
  pBVar6 = ip + 1;
  if (pBVar6 < iend + -uVar4) {
    offset = (int)ip - (int)(state->window).base;
    do {
      offset = offset + 1;
      rollingHash = (rollingHash - ((ulong)pBVar6[-1] + 10) * state->hashPower) *
                    -0x30e44323485a9b9d + (ulong)pBVar6[uVar3 - 1] + 10;
      ZSTD_ldm_makeEntryAndInsertByTag(state,rollingHash,UVar1 - UVar2,offset,ldmParams);
      pBVar6 = pBVar6 + 1;
    } while (pBVar6 != iend + -uVar4);
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* state, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U64 startingHash = ZSTD_rollingHash_compute(ip, params->minMatchLength);
    ZSTD_ldm_fillLdmHashTable(
        state, startingHash, ip, iend - params->minMatchLength, state->window.base,
        params->hashLog - params->bucketSizeLog,
        *params);
}